

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall icu_63::Formattable::Formattable(Formattable *this,Formattable *source)

{
  Formattable *ctx;
  Formattable *source_local;
  Formattable *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_004de5e8;
  ctx = this;
  UObject::UObject(&this->super_UObject,&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_004de5e8;
  UnicodeString::UnicodeString(&this->fBogus);
  init(this,(EVP_PKEY_CTX *)ctx);
  operator=(this,source);
  return;
}

Assistant:

Formattable::Formattable(const Formattable &source)
     :  UObject(*this)
{
    init();
    *this = source;
}